

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O3

void __thiscall ArithmeticEncoder::writeByte(ArithmeticEncoder *this,U8 sym)

{
  U32 *pUVar1;
  uint uVar2;
  U8 *pUVar3;
  uint uVar4;
  U8 *pUVar5;
  undefined7 in_register_00000031;
  
  uVar4 = this->length >> 8;
  this->length = uVar4;
  uVar4 = uVar4 * (int)CONCAT71(in_register_00000031,sym);
  pUVar1 = &this->base;
  uVar2 = *pUVar1;
  *pUVar1 = *pUVar1 + uVar4;
  if (CARRY4(uVar2,uVar4)) {
    pUVar5 = this->outbyte;
    if (pUVar5 == this->outbuffer) {
      pUVar5 = this->endbuffer;
    }
    pUVar5 = pUVar5 + -1;
    while (*pUVar5 == 0xff) {
      *pUVar5 = '\0';
      pUVar3 = this->endbuffer;
      if (pUVar5 == this->outbuffer) {
        pUVar5 = pUVar3;
      }
      pUVar5 = pUVar5 + -1;
      if (pUVar5 < this->outbuffer) {
        __assert_fail("outbuffer <= p",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                      ,0x14d,"void ArithmeticEncoder::propagate_carry()");
      }
      if (pUVar3 <= pUVar5) {
        __assert_fail("p < endbuffer",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                      ,0x14e,"void ArithmeticEncoder::propagate_carry()");
      }
      if (pUVar3 <= this->outbyte) {
        __assert_fail("outbyte < endbuffer",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                      ,0x14f,"void ArithmeticEncoder::propagate_carry()");
      }
    }
    *pUVar5 = *pUVar5 + '\x01';
    if (0xffffff < this->length) {
      return;
    }
  }
  renorm_enc_interval(this);
  return;
}

Assistant:

void ArithmeticEncoder::writeByte(U8 sym)
{
  U32 init_base = base;
  base += (U32)(sym) * (length >>= 8);           // new interval base and length

  if (init_base > base) propagate_carry();                 // overflow = carry
  if (length < AC__MinLength) renorm_enc_interval();        // renormalization
}